

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3GetInt32(char *zNum,int *pValue)

{
  char cVar1;
  ulong uVar2;
  byte bVar3;
  uint uVar4;
  long lVar5;
  char *pcVar6;
  byte *pbVar7;
  long lVar8;
  bool bVar9;
  
  cVar1 = *zNum;
  if (cVar1 == '-') {
    lVar5 = -1;
    zNum = zNum + 1;
  }
  else {
    if (cVar1 == '0') {
      if (((byte)(zNum[1] | 0x20U) == 0x78) && ((""[(byte)zNum[2]] & 8) != 0)) {
        pbVar7 = (byte *)(zNum + 2);
        do {
          bVar3 = *pbVar7;
          pbVar7 = pbVar7 + 1;
        } while (bVar3 == 0x30);
        uVar2 = 0;
        uVar4 = 0;
        while ((uVar2 < 8 && ((""[bVar3] & 8) != 0))) {
          uVar4 = uVar4 << 4 | (uint)(((char)(bVar3 * '\x02') >> 7 & 9U) + bVar3 & 0xf);
          bVar3 = pbVar7[uVar2];
          uVar2 = uVar2 + 1;
        }
        if ((int)uVar4 < 0) {
          return 0;
        }
        if ((""[bVar3] & 8) != 0) {
          return 0;
        }
        goto LAB_00136f35;
      }
    }
    else if (cVar1 == '+') {
      zNum = zNum + 1;
    }
    lVar5 = 0;
  }
  do {
    pcVar6 = zNum;
    zNum = pcVar6 + 1;
  } while (*pcVar6 == '0');
  lVar8 = 0;
  for (uVar2 = 0; uVar2 != 0xb; uVar2 = uVar2 + 1) {
    if (9 < (byte)(pcVar6[uVar2] - 0x30U)) {
      bVar9 = 10 < uVar2;
      goto LAB_00136f16;
    }
    lVar8 = (ulong)((byte)pcVar6[uVar2] & 0xf) + lVar8 * 10;
  }
  bVar9 = true;
LAB_00136f16:
  if (bVar9) {
    return 0;
  }
  if (0x7fffffff < lVar5 + lVar8) {
    return 0;
  }
  uVar4 = -(uint)lVar8;
  if (cVar1 != '-') {
    uVar4 = (uint)lVar8;
  }
LAB_00136f35:
  *pValue = uVar4;
  return 1;
}

Assistant:

SQLITE_PRIVATE int sqlite3GetInt32(const char *zNum, int *pValue){
  sqlite_int64 v = 0;
  int i, c;
  int neg = 0;
  if( zNum[0]=='-' ){
    neg = 1;
    zNum++;
  }else if( zNum[0]=='+' ){
    zNum++;
  }
#ifndef SQLITE_OMIT_HEX_INTEGER
  else if( zNum[0]=='0'
        && (zNum[1]=='x' || zNum[1]=='X')
        && sqlite3Isxdigit(zNum[2])
  ){
    u32 u = 0;
    zNum += 2;
    while( zNum[0]=='0' ) zNum++;
    for(i=0; sqlite3Isxdigit(zNum[i]) && i<8; i++){
      u = u*16 + sqlite3HexToInt(zNum[i]);
    }
    if( (u&0x80000000)==0 && sqlite3Isxdigit(zNum[i])==0 ){
      memcpy(pValue, &u, 4);
      return 1;
    }else{
      return 0;
    }
  }
#endif
  while( zNum[0]=='0' ) zNum++;
  for(i=0; i<11 && (c = zNum[i] - '0')>=0 && c<=9; i++){
    v = v*10 + c;
  }

  /* The longest decimal representation of a 32 bit integer is 10 digits:
  **
  **             1234567890
  **     2^31 -> 2147483648
  */
  testcase( i==10 );
  if( i>10 ){
    return 0;
  }
  testcase( v-neg==2147483647 );
  if( v-neg>2147483647 ){
    return 0;
  }
  if( neg ){
    v = -v;
  }
  *pValue = (int)v;
  return 1;
}